

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O2

void makeTiled(char *inFileName,char *outFileName,int partnum,LevelMode mode,
              LevelRoundingMode roundingMode,Compression compression,int tileSizeX,int tileSizeY,
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *doNotFilter,Extrapolation extX,Extrapolation extY,bool verbose)

{
  pointer pHVar1;
  pointer pHVar2;
  Image *pIVar3;
  char cVar4;
  __type _Var5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ostream *poVar11;
  Header *pHVar12;
  Box2i *dataWindow;
  _Rb_tree_node_base *p_Var13;
  _Rb_tree_node_base *p_Var14;
  ImageChannel *pIVar15;
  long lVar16;
  Compression *pCVar17;
  string *psVar18;
  ChannelList *pCVar19;
  ulong uVar20;
  InputExc *this;
  NoImplExc *this_00;
  bool odd;
  Extrapolation ext;
  int y;
  LevelMode lx;
  int x;
  int iVar21;
  Image *image0_00;
  Image *image;
  undefined1 auVar22 [12];
  Image *local_258;
  InputPart in;
  Image *local_240;
  MultiPartInputFile input;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  Header h;
  int iStack_1ec;
  TiledInputPart in_1;
  MultiPartOutputFile output;
  Header header;
  Image image0;
  TiledOutputPart out;
  FrameBuffer fb;
  Image image1;
  Image image2;
  
  Image::Image(&image0);
  Image::Image(&image1);
  Image::Image(&image2);
  _h = 0;
  iStack_1ec = 0;
  Imf_3_2::Header::Header(&header,0x40,0x40,1.0,(Vec2 *)&h,1.0,INCREASING_Y,ZIP_COMPRESSION);
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(&input,inFileName,iVar6,true);
  uVar7 = Imf_3_2::MultiPartInputFile::parts();
  uVar8 = 0;
  if ((int)uVar7 < 1) {
    uVar7 = uVar8;
  }
  do {
    pHVar2 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pHVar1 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar8 == uVar7) {
      iVar6 = Imf_3_2::globalThreadCount();
      Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
                (&output,outFileName,pHVar1,(int)(((long)pHVar2 - (long)pHVar1) / 0x38),false,iVar6)
      ;
      for (uVar20 = 0; uVar20 != uVar7; uVar20 = uVar20 + 1) {
        if (uVar20 == (uint)partnum) {
          Imf_3_2::TiledOutputPart::TiledOutputPart(&out,&output,partnum);
          Imf_3_2::TiledOutputPart::setFrameBuffer((FrameBuffer *)&out);
          if (verbose) {
            poVar11 = std::operator<<((ostream *)&std::cout,"writing file ");
            poVar11 = std::operator<<(poVar11,outFileName);
            poVar11 = std::operator<<(poVar11,"\nlevel (0, 0)");
            std::endl<char,std::char_traits<char>>(poVar11);
          }
          iVar6 = 0;
          while( true ) {
            iVar21 = (int)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out;
            iVar9 = Imf_3_2::TiledOutputPart::numYTiles(iVar21);
            if (iVar9 <= iVar6) break;
            for (iVar9 = 0; iVar10 = Imf_3_2::TiledOutputPart::numXTiles(iVar21), iVar9 < iVar10;
                iVar9 = iVar9 + 1) {
              Imf_3_2::TiledOutputPart::writeTile(iVar21,iVar9,iVar6);
            }
            iVar6 = iVar6 + 1;
          }
          lx = mode;
          if (mode == MIPMAP_LEVELS) {
            for (; iVar6 = Imf_3_2::TiledOutputPart::numLevels(), (int)lx < iVar6;
                lx = lx + MIPMAP_LEVELS) {
              Imf_3_2::TiledOutputPart::dataWindowForLevel((int)(Box2i *)&h,iVar21);
              Image::resize(&image1,(Box2i *)&h);
              pCVar19 = (ChannelList *)Imf_3_2::Header::channels();
              odd = (bool)((byte)lx & 1);
              anon_unknown.dwarf_1a7e6::reduceX(pCVar19,doNotFilter,extX,odd,&image0,&image1);
              Imf_3_2::TiledOutputPart::dataWindowForLevel((int)(Box2i *)&h,iVar21);
              Image::resize(&image0,(Box2i *)&h);
              pCVar19 = (ChannelList *)Imf_3_2::Header::channels();
              anon_unknown.dwarf_1a7e6::reduceY(pCVar19,doNotFilter,extY,odd,&image1,&image0);
              if (verbose) {
                poVar11 = std::operator<<((ostream *)&std::cout,"level (");
                poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,lx);
                poVar11 = std::operator<<(poVar11,", ");
                poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,lx);
                poVar11 = std::operator<<(poVar11,")");
                std::endl<char,std::char_traits<char>>(poVar11);
              }
              pCVar19 = (ChannelList *)Imf_3_2::Header::channels();
              anon_unknown.dwarf_1a7e6::storeLevel(&out,pCVar19,lx,lx,&image0);
            }
          }
          else if (mode == RIPMAP_LEVELS) {
            local_240 = &image1;
            image0_00 = &image0;
            local_258 = &image2;
            for (iVar6 = 0; iVar9 = Imf_3_2::TiledOutputPart::numYLevels(), iVar6 < iVar9;
                iVar6 = iVar6 + 1) {
              iVar9 = Imf_3_2::TiledOutputPart::numYLevels();
              if (iVar6 < iVar9 + -1) {
                Imf_3_2::TiledOutputPart::dataWindowForLevel((int)(Box2i *)&h,iVar21);
                Image::resize(local_258,(Box2i *)&h);
                pCVar19 = (ChannelList *)Imf_3_2::Header::channels();
                anon_unknown.dwarf_1a7e6::reduceY
                          (pCVar19,doNotFilter,extY,(bool)((byte)iVar6 & 1),image0_00,local_258);
              }
              iVar9 = 0;
              pIVar3 = local_240;
              image = image0_00;
              while (local_240 = pIVar3, iVar10 = Imf_3_2::TiledOutputPart::numXLevels(),
                    iVar9 < iVar10) {
                if (iVar9 != 0 || iVar6 != 0) {
                  if (verbose) {
                    poVar11 = std::operator<<((ostream *)&std::cout,"level (");
                    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,iVar9);
                    poVar11 = std::operator<<(poVar11,", ");
                    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,iVar6);
                    poVar11 = std::operator<<(poVar11,")");
                    std::endl<char,std::char_traits<char>>(poVar11);
                  }
                  pCVar19 = (ChannelList *)Imf_3_2::Header::channels();
                  anon_unknown.dwarf_1a7e6::storeLevel(&out,pCVar19,iVar9,iVar6,image);
                }
                iVar10 = Imf_3_2::TiledOutputPart::numXLevels();
                if (iVar9 < iVar10 + -1) {
                  Imf_3_2::TiledOutputPart::dataWindowForLevel((int)(Box2i *)&h,iVar21);
                  Image::resize(local_240,(Box2i *)&h);
                  pCVar19 = (ChannelList *)Imf_3_2::Header::channels();
                  anon_unknown.dwarf_1a7e6::reduceX
                            (pCVar19,doNotFilter,extX,(bool)((byte)iVar9 & 1),image,local_240);
                  iVar9 = iVar9 + 1;
                  pIVar3 = image;
                  image = local_240;
                }
                else {
                  iVar9 = iVar9 + 1;
                  pIVar3 = local_240;
                }
              }
              image0_00 = local_258;
              local_258 = image;
            }
          }
        }
        else {
          Imf_3_2::Header::Header
                    (&h,headers.
                        super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar20 * 0x38);
          psVar18 = (string *)Imf_3_2::Header::type_abi_cxx11_();
          std::__cxx11::string::string((string *)&out,psVar18);
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&out,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)Imf_3_2::TILEDIMAGE_abi_cxx11_);
          iVar6 = (int)uVar20;
          if (_Var5) {
            Imf_3_2::TiledInputPart::TiledInputPart(&in_1,&input,iVar6);
            Imf_3_2::TiledOutputPart::TiledOutputPart((TiledOutputPart *)&in,&output,iVar6);
            Imf_3_2::TiledOutputPart::copyPixels((TiledInputPart *)&in);
          }
          else {
            _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&out,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)Imf_3_2::SCANLINEIMAGE_abi_cxx11_);
            if (_Var5) {
              Imf_3_2::InputPart::InputPart((InputPart *)&in_1,&input,iVar6);
              Imf_3_2::OutputPart::OutputPart((OutputPart *)&in,&output,iVar6);
              Imf_3_2::OutputPart::copyPixels(&in);
            }
            else {
              _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&out,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)Imf_3_2::DEEPSCANLINE_abi_cxx11_);
              if (_Var5) {
                Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                          ((DeepScanLineInputPart *)&in_1,&input,iVar6);
                Imf_3_2::DeepScanLineOutputPart::DeepScanLineOutputPart
                          ((DeepScanLineOutputPart *)&in,&output,iVar6);
                Imf_3_2::DeepScanLineOutputPart::copyPixels((DeepScanLineInputPart *)&in);
              }
              else {
                _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&out,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)Imf_3_2::DEEPTILE_abi_cxx11_);
                if (_Var5) {
                  Imf_3_2::DeepTiledInputPart::DeepTiledInputPart
                            ((DeepTiledInputPart *)&in_1,&input,iVar6);
                  Imf_3_2::DeepTiledOutputPart::DeepTiledOutputPart
                            ((DeepTiledOutputPart *)&in,&output,iVar6);
                  Imf_3_2::DeepTiledOutputPart::copyPixels((DeepTiledInputPart *)&in);
                }
              }
            }
          }
          std::__cxx11::string::~string((string *)&out);
          Imf_3_2::Header::~Header(&h);
        }
      }
      if (verbose) {
        poVar11 = std::operator<<((ostream *)&std::cout,"done.");
        std::endl<char,std::char_traits<char>>(poVar11);
      }
      Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&output);
      Imf_3_2::MultiPartInputFile::~MultiPartInputFile(&input);
      std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&headers);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&fb);
      Imf_3_2::Header::~Header(&header);
      Image::~Image(&image2);
      Image::~Image(&image1);
      Image::~Image(&image0);
      return;
    }
    if (verbose) {
      poVar11 = std::operator<<((ostream *)&std::cout,"reading file ");
      poVar11 = std::operator<<(poVar11,inFileName);
      std::endl<char,std::char_traits<char>>(poVar11);
    }
    if (uVar8 == partnum) {
      Imf_3_2::InputPart::InputPart(&in,&input,partnum);
      pHVar12 = (Header *)Imf_3_2::InputPart::header();
      Imf_3_2::Header::operator=(&header,pHVar12);
      cVar4 = Imf_3_2::hasEnvmap(&header);
      if (cVar4 == '\x01' && mode != ONE_LEVEL) {
        this_00 = (NoImplExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::NoImplExc::NoImplExc
                  (this_00,
                   "This program cannot generate multiresolution environment maps.  Use exrenvmap instead."
                  );
        __cxa_throw(this_00,&Iex_3_2::NoImplExc::typeinfo,Iex_3_2::NoImplExc::~NoImplExc);
      }
      dataWindow = (Box2i *)Imf_3_2::Header::dataWindow();
      Image::resize(&image0,dataWindow);
      Imf_3_2::Header::channels();
      p_Var13 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
      while( true ) {
        Imf_3_2::Header::channels();
        p_Var14 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
        if (p_Var13 == p_Var14) break;
        if ((*(int *)&p_Var13[9].field_0x4 != 1) || (*(int *)&p_Var13[9]._M_parent != 1)) {
          this = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc
                    (this,"Sub-sampled image channels are not supported in tiled files.");
          __cxa_throw(this,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
        }
        p_Var14 = p_Var13 + 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&h,(char *)p_Var14,(allocator<char> *)&out);
        Image::addChannel(&image0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&h,p_Var13[9]._M_color);
        std::__cxx11::string::~string((string *)&h);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&h,(char *)p_Var14,(allocator<char> *)&out);
        Image::addChannel(&image1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&h,p_Var13[9]._M_color);
        std::__cxx11::string::~string((string *)&h);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&h,(char *)p_Var14,(allocator<char> *)&out);
        Image::addChannel(&image2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&h,p_Var13[9]._M_color);
        std::__cxx11::string::~string((string *)&h);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&out,(char *)p_Var14,(allocator<char> *)&output);
        pIVar15 = Image::channel(&image0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&out);
        (*pIVar15->_vptr_ImageChannel[2])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,pIVar15);
        Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)p_Var14);
        std::__cxx11::string::~string((string *)&out);
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
      }
      Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&in);
      lVar16 = Imf_3_2::Header::dataWindow();
      iVar6 = *(int *)(lVar16 + 4);
      Imf_3_2::Header::dataWindow();
      Imf_3_2::InputPart::readPixels((int)&in,iVar6);
      iStack_1ec = tileSizeY;
      _h = tileSizeX;
      Imf_3_2::Header::setTileDescription((TileDescription *)&header);
      pCVar17 = (Compression *)Imf_3_2::Header::compression();
      *pCVar17 = compression;
      auVar22 = Imf_3_2::Header::lineOrder();
      *auVar22._0_8_ = 0;
      if (mode != ONE_LEVEL) {
        (anonymous_namespace)::extToString_abi_cxx11_
                  ((string *)&output,(_anonymous_namespace_ *)(ulong)extX,auVar22._8_4_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                       (string *)&output,",");
        (anonymous_namespace)::extToString_abi_cxx11_
                  ((string *)&in_1,(_anonymous_namespace_ *)(ulong)extY,ext);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                       (string *)&in_1);
        Imf_3_2::addWrapmodes(&header,(string *)&h);
        std::__cxx11::string::~string((string *)&h);
        std::__cxx11::string::~string((string *)&in_1);
        std::__cxx11::string::~string((string *)&out);
        std::__cxx11::string::~string((string *)&output);
      }
      Imf_3_2::Header::setType((string *)&header);
      Imf_3_2::getChunkOffsetTableSize(&header);
      Imf_3_2::Header::setChunkCount((int)(TileDescription *)&header);
      std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                (&headers,(value_type *)&header);
    }
    else {
      pHVar12 = (Header *)Imf_3_2::MultiPartInputFile::header((int)&input);
      Imf_3_2::Header::Header(&h,pHVar12);
      std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                (&headers,(value_type *)&h);
      Imf_3_2::Header::~Header(&h);
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void
makeTiled (
    const char         inFileName[],
    const char         outFileName[],
    int                partnum,
    LevelMode          mode,
    LevelRoundingMode  roundingMode,
    Compression        compression,
    int                tileSizeX,
    int                tileSizeY,
    const set<string>& doNotFilter,
    Extrapolation      extX,
    Extrapolation      extY,
    bool               verbose)
{
    Image          image0;
    Image          image1;
    Image          image2;
    Header         header;
    FrameBuffer    fb;
    vector<Header> headers;

    //
    // Load the input image
    //

    MultiPartInputFile input (inFileName);
    int                parts = input.parts ();

    for (int p = 0; p < parts; p++)
    {
        if (verbose) cout << "reading file " << inFileName << endl;

        if (p == partnum)
        {
            InputPart in (input, p);
            header = in.header ();
            if (hasEnvmap (header) && mode != ONE_LEVEL)
            {
                //
                // Proper low-pass filtering and subsampling
                // of environment maps is not implemented in
                // this program.
                //

                throw IEX_NAMESPACE::NoImplExc (
                    "This program cannot generate "
                    "multiresolution environment maps.  "
                    "Use exrenvmap instead.");
            }

            image0.resize (header.dataWindow ());

            for (ChannelList::ConstIterator i = header.channels ().begin ();
                 i != header.channels ().end ();
                 ++i)
            {
                const char*    name    = i.name ();
                const Channel& channel = i.channel ();

                if (channel.xSampling != 1 || channel.ySampling != 1)
                {
                    throw IEX_NAMESPACE::InputExc (
                        "Sub-sampled image channels are "
                        "not supported in tiled files.");
                }

                image0.addChannel (name, channel.type);
                image1.addChannel (name, channel.type);
                image2.addChannel (name, channel.type);
                fb.insert (name, image0.channel (name).slice ());
            }

            in.setFrameBuffer (fb);
            in.readPixels (
                header.dataWindow ().min.y, header.dataWindow ().max.y);

            //
            // Generate the header for the output file by modifying
            // the input file's header
            //

            header.setTileDescription (
                TileDescription (tileSizeX, tileSizeY, mode, roundingMode));

            header.compression () = compression;
            header.lineOrder ()   = INCREASING_Y;

            if (mode != ONE_LEVEL)
                addWrapmodes (
                    header, extToString (extX) + "," + extToString (extY));

            //
            // set tileDescription, type, and chunckcount for multipart
            //
            header.setType (TILEDIMAGE);
            int chunkcount = getChunkOffsetTableSize (header);
            header.setChunkCount (chunkcount);

            headers.push_back (header);
        }
        else
        {
            Header h = input.header (p);
            headers.push_back (h);
        }
    }

    //
    // Store the highest-resolution level of the image in the output file
    //

    MultiPartOutputFile output (outFileName, &headers[0], headers.size ());

    for (int p = 0; p < parts; p++)
    {
        if (p == partnum)
        {
            try
            {
                TiledOutputPart out (output, partnum);
                //    TiledOutputFile out (outFileName, header);

                out.setFrameBuffer (fb);

                if (verbose)
                    cout << "writing file " << outFileName
                         << "\n"
                            "level (0, 0)"
                         << endl;

                for (int y = 0; y < out.numYTiles (0); ++y)
                    for (int x = 0; x < out.numXTiles (0); ++x)
                        out.writeTile (x, y, 0);

                //
                // If necessary, generate the lower-resolution mipmap
                // or ripmap levels, and store them in the output file.
                //

                if (mode == MIPMAP_LEVELS)
                {
                    for (int l = 1; l < out.numLevels (); ++l)
                    {
                        image1.resize (out.dataWindowForLevel (l, l - 1));

                        reduceX (
                            header.channels (),
                            doNotFilter,
                            extX,
                            l & 1,
                            image0,
                            image1);

                        image0.resize (out.dataWindowForLevel (l, l));

                        reduceY (
                            header.channels (),
                            doNotFilter,
                            extY,
                            l & 1,
                            image1,
                            image0);

                        if (verbose)
                            cout << "level (" << l << ", " << l << ")" << endl;

                        storeLevel (out, header.channels (), l, l, image0);
                    }
                }

                if (mode == RIPMAP_LEVELS)
                {
                    Image* iptr0 = &image0;
                    Image* iptr1 = &image1;
                    Image* iptr2 = &image2;

                    for (int ly = 0; ly < out.numYLevels (); ++ly)
                    {
                        if (ly < out.numYLevels () - 1)
                        {
                            iptr2->resize (out.dataWindowForLevel (0, ly + 1));

                            reduceY (
                                header.channels (),
                                doNotFilter,
                                extY,
                                ly & 1,
                                *iptr0,
                                *iptr2);
                        }

                        for (int lx = 0; lx < out.numXLevels (); ++lx)
                        {
                            if (lx != 0 || ly != 0)
                            {
                                if (verbose)
                                    cout << "level (" << lx << ", " << ly << ")"
                                         << endl;

                                storeLevel (
                                    out, header.channels (), lx, ly, *iptr0);
                            }

                            if (lx < out.numXLevels () - 1)
                            {
                                iptr1->resize (
                                    out.dataWindowForLevel (lx + 1, ly));

                                reduceX (
                                    header.channels (),
                                    doNotFilter,
                                    extX,
                                    lx & 1,
                                    *iptr0,
                                    *iptr1);

                                swap (iptr0, iptr1);
                            }
                        }

                        swap (iptr2, iptr0);
                    }
                }
            }
            catch (const exception& e)
            {
                cerr << e.what () << endl;
            }
        }
        else
        {
            Header      header = headers[p];
            std::string type   = header.type ();
            if (type == TILEDIMAGE)
            {
                TiledInputPart  in (input, p);
                TiledOutputPart out (output, p);
                out.copyPixels (in);
            }
            else if (type == SCANLINEIMAGE)
            {
                using std::max;
                InputPart  in (input, p);
                OutputPart out (output, p);
                out.copyPixels (in);
            }
            else if (type == DEEPSCANLINE)
            {
                DeepScanLineInputPart  in (input, p);
                DeepScanLineOutputPart out (output, p);
                out.copyPixels (in);
            }
            else if (type == DEEPTILE)
            {
                DeepTiledInputPart  in (input, p);
                DeepTiledOutputPart out (output, p);
                out.copyPixels (in);
            }
        }
    }

    if (verbose) cout << "done." << endl;
}